

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

Matrix * __thiscall Matrix::differentiate(Matrix *this)

{
  uint uVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  int *piVar6;
  int *piVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  int i;
  long lVar12;
  int i_1;
  int iVar13;
  double dVar14;
  
  iVar4 = this->nMatrixDimension;
  uVar1 = iVar4 - 1;
  uVar9 = 0xffffffffffffffff;
  if (0 < iVar4) {
    uVar9 = (long)(int)uVar1 * 4;
  }
  pvVar8 = operator_new__(uVar9);
  uVar10 = 0;
  uVar9 = 0;
  if (0 < (int)uVar1) {
    uVar9 = (ulong)uVar1;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    *(undefined4 *)((long)pvVar8 + uVar10 * 4) = 0;
  }
  pdVar5 = this->pData;
  piVar6 = this->pSize;
  do {
    if (uVar1 == 0) {
      bVar11 = true;
    }
    else {
      piVar7 = this->pSize;
      bVar11 = false;
      for (lVar12 = (long)(iVar4 + -2);
          (lVar12 != -1 &&
          (iVar13 = *(int *)((long)pvVar8 + lVar12 * 4) + 1,
          *(int *)((long)pvVar8 + lVar12 * 4) = iVar13, iVar13 == piVar7[lVar12]));
          lVar12 = lVar12 + -1) {
        *(undefined4 *)((long)pvVar8 + lVar12 * 4) = 0;
        bVar11 = (bool)(bVar11 | lVar12 == 0);
      }
    }
    iVar13 = 0;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      iVar13 = iVar13 + this->pMult[uVar10] * *(int *)((long)pvVar8 + uVar10 * 4);
    }
    pdVar2 = pdVar5 + iVar13;
    iVar13 = piVar6[(int)uVar1];
    dVar14 = *pdVar2;
    for (lVar12 = 1; lVar12 < iVar13; lVar12 = lVar12 + 1) {
      dVar3 = pdVar2[lVar12];
      pdVar2[lVar12] = dVar3 - dVar14;
      dVar14 = dVar3;
    }
  } while (!bVar11);
  operator_delete__(pvVar8);
  return this;
}

Assistant:

Matrix &Matrix::differentiate()
{
	int n = nMatrixDimension-1;
	bool done = false;
	int *indices = new int[n];
	for (int i=0; i<n; ++i)
		indices[i] = 0;
	
	while (!done) {
		
		// increase indices
		if (!n)
			done = true;
		else for (int dim=n-1; dim+1; --dim) {
			indices[dim]++;
			if (indices[dim] == pSize[dim]) {
				indices[dim] = 0;
				if (!dim) 
					done = true;
			} else
				break;
		}
		
		// create offset from indices
		int offset = 0;
		for (int i=0; i<n; ++i)
			offset += indices[i]*pMult[i];
		
		// differentiate last dimension of this offset
		double last = pData[offset];
		for (int i=1; i<pSize[n]; ++i) {
			double next = pData[offset+i] - last;
			last = pData[offset+i];
			pData[offset+i] = next;
		}
	}
	
	delete[] indices;
	return *this;
}